

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O1

void __thiscall TLeonardoHeap<double>::dequeue_max(TLeonardoHeap<double> *this,size_t element)

{
  double dVar1;
  double *pdVar2;
  ushort uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  double tmp;
  
  uVar3 = this->first_tree;
  uVar9 = (ulong)uVar3;
  if (uVar9 < 2) {
    uVar8 = this->tree_vector >> 1;
    this->tree_vector = uVar8;
    if (uVar9 == 0) {
      this->first_tree = 1;
      return;
    }
    this->first_tree = (unsigned_short)(uVar9 + 1);
    uVar5 = this->N + 1;
    if (uVar9 + 1 < uVar5) {
      uVar3 = uVar3 + 2;
      do {
        if ((uVar8 & 1) != 0) {
          return;
        }
        this->first_tree = uVar3;
        uVar8 = uVar8 >> 1;
        this->tree_vector = uVar8;
        uVar9 = (ulong)uVar3;
        uVar3 = uVar3 + 1;
      } while (uVar9 < uVar5);
    }
    return;
  }
  uVar7 = this->tree_vector * 2 ^ 3;
  this->tree_vector = uVar7;
  this->first_tree = uVar3 - 2;
  uVar4 = (ulong)(ushort)(uVar3 - 2);
  uVar8 = Leonardo_k[uVar4];
  uVar5 = Leonardo_k[uVar4 + 1];
  uVar10 = ~uVar8 + element;
  uVar9 = uVar4 + 1;
  if (uVar5 <= uVar10) {
    pdVar2 = this->data;
    uVar6 = this->N;
    uVar12 = uVar6 + 1;
    uVar13 = 2;
    do {
      uVar11 = uVar10 - uVar5;
      dVar1 = pdVar2[uVar10];
      if (pdVar2[uVar11] <= dVar1) break;
      pdVar2[uVar10] = pdVar2[uVar11];
      pdVar2[uVar11] = dVar1;
      uVar9 = uVar9 + 1;
      uVar5 = uVar9;
      uVar10 = uVar13;
      if (uVar9 < uVar12) {
        do {
          uVar13 = uVar10 * 2;
          uVar9 = uVar5;
          if ((uVar10 & uVar7) != 0) break;
          bVar14 = uVar5 != uVar6;
          uVar9 = uVar12;
          uVar5 = uVar5 + 1;
          uVar10 = uVar13;
        } while (bVar14);
      }
      uVar5 = Leonardo_k[uVar9];
      uVar10 = uVar11;
    } while (uVar5 <= uVar11);
  }
  if (1 < uVar9) {
    pdVar2 = this->data;
    do {
      uVar12 = (uVar10 - 1) -
               *(long *)("basic_string::_M_construct null not valid" + uVar9 * 8 + 0x23);
      uVar5 = uVar10 - 1;
      if (pdVar2[uVar10 - 1] <= pdVar2[uVar12]) {
        uVar5 = uVar12;
      }
      dVar1 = pdVar2[uVar10];
      if (pdVar2[uVar5] <= dVar1) break;
      if (pdVar2[uVar12] < pdVar2[uVar10 - 1]) {
        uVar9 = uVar9 - 2;
      }
      else {
        uVar9 = uVar9 - 1;
      }
      pdVar2[uVar10] = pdVar2[uVar5];
      pdVar2[uVar5] = dVar1;
      uVar10 = uVar5;
    } while (1 < uVar9);
  }
  uVar9 = uVar7 * 2 + 1;
  this->tree_vector = uVar9;
  uVar5 = element - 1;
  if (uVar8 <= uVar5) {
    pdVar2 = this->data;
    uVar7 = this->N;
    uVar10 = uVar7 + 1;
    uVar12 = 2;
    do {
      uVar6 = uVar5 - uVar8;
      dVar1 = pdVar2[uVar5];
      if (pdVar2[uVar6] <= dVar1) break;
      pdVar2[uVar5] = pdVar2[uVar6];
      pdVar2[uVar6] = dVar1;
      uVar4 = uVar4 + 1;
      uVar8 = uVar4;
      uVar5 = uVar12;
      if (uVar4 < uVar10) {
        do {
          uVar12 = uVar5 * 2;
          uVar4 = uVar8;
          if ((uVar5 & uVar9) != 0) break;
          bVar14 = uVar8 != uVar7;
          uVar4 = uVar10;
          uVar8 = uVar8 + 1;
          uVar5 = uVar12;
        } while (bVar14);
      }
      uVar8 = Leonardo_k[uVar4];
      uVar5 = uVar6;
    } while (uVar8 <= uVar6);
  }
  if (1 < uVar4) {
    pdVar2 = this->data;
    do {
      uVar8 = (uVar5 - 1) -
              *(long *)("basic_string::_M_construct null not valid" + uVar4 * 8 + 0x23);
      uVar9 = uVar5 - 1;
      if (pdVar2[uVar5 - 1] <= pdVar2[uVar8]) {
        uVar9 = uVar8;
      }
      dVar1 = pdVar2[uVar5];
      if (pdVar2[uVar9] <= dVar1) {
        return;
      }
      if (pdVar2[uVar8] < pdVar2[uVar5 - 1]) {
        uVar4 = uVar4 - 2;
      }
      else {
        uVar4 = uVar4 - 1;
      }
      pdVar2[uVar5] = pdVar2[uVar9];
      pdVar2[uVar9] = dVar1;
      uVar5 = uVar9;
    } while (1 < uVar4);
  }
  return;
}

Assistant:

inline void TLeonardoHeap<T>::dequeue_max(size_t element) {
	if(first_tree >= 2) {	// Root is of order greater than two
		// Expose the two child nodes as tree roots
		// Restore the ascending root and max-heap properties of the exposed tree to the left
		tree_vector = (tree_vector << 1) ^ 3;	// w1 -> w01
		first_tree -= 2;
		filter(element-Leonardo_k[first_tree]-1, first_tree+1, false);
		// Restore the ascending root and max-heap properties of the exposed tree to the right
		tree_vector = (tree_vector << 1) | 1;	// w01 -> w011
		filter(element-1, first_tree, false);
	} else if(first_tree == 0) {
		// Remove the Lt_0 tree, leaving the Lt_1 tree on the right
		tree_vector >>= 1;
		first_tree = 1;
	} else {	// The rightmost root is of order 1
		// Search for the next tree
		tree_vector >>=1;
		first_tree++;
		for(; first_tree<N+1; first_tree++, tree_vector>>=1) { if(tree_vector & 1) { break; } }
	}
}